

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_from_entries.cpp
# Opt level: O0

void duckdb::MapFromEntriesFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  vector<duckdb::Vector,_true> *this;
  reference pvVar1;
  ulong uVar2;
  Vector *in_RDX;
  DataChunk *in_RDI;
  idx_t count;
  Vector *pVVar3;
  
  this = (vector<duckdb::Vector,_true> *)DataChunk::size(in_RDI);
  pVVar3 = in_RDX;
  pvVar1 = vector<duckdb::Vector,_true>::operator[](this,(size_type)in_RDX);
  duckdb::MapUtil::ReinterpretMap(pVVar3,pvVar1,(ulong)this);
  duckdb::MapVector::MapConversionVerify(in_RDX,(ulong)this);
  duckdb::Vector::Verify((ulong)in_RDX);
  uVar2 = duckdb::DataChunk::AllConstant();
  if ((uVar2 & 1) != 0) {
    duckdb::Vector::SetVectorType((VectorType)in_RDX);
  }
  return;
}

Assistant:

static void MapFromEntriesFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto count = args.size();

	MapUtil::ReinterpretMap(result, args.data[0], count);
	MapVector::MapConversionVerify(result, count);
	result.Verify(count);

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}